

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnmdec.c
# Opt level: O0

size_t ReadLine(uint8_t *data,size_t off,size_t data_size,char *out,size_t *out_size)

{
  size_t sVar1;
  size_t i;
  size_t *out_size_local;
  char *out_local;
  size_t data_size_local;
  size_t off_local;
  uint8_t *data_local;
  
  *out_size = 0;
  off_local = off;
  do {
    for (i = 0; i < 0x400 && off_local < data_size; i = i + 1) {
      sVar1 = off_local + 1;
      out[i] = data[off_local];
      off_local = sVar1;
      if (out[i] == '\n') break;
    }
    if ((data_size <= off_local) || ((i != 0 && (*out != '#')))) {
      out[i] = '\0';
      *out_size = i;
      return off_local;
    }
  } while( true );
}

Assistant:

static size_t ReadLine(const uint8_t* const data, size_t off, size_t data_size,
                       char out[MAX_LINE_SIZE + 1], size_t* const out_size) {
  size_t i = 0;
  *out_size = 0;
 redo:
  for (i = 0; i < MAX_LINE_SIZE && off < data_size; ++i) {
    out[i] = data[off++];
    if (out[i] == '\n') break;
  }
  if (off < data_size) {
    if (i == 0) goto redo;         // empty line
    if (out[0] == '#') goto redo;  // skip comment
  }
  out[i] = 0;   // safety sentinel
  *out_size = i;
  return off;
}